

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
::CreateTest(ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
             *this)

{
  ParameterizedTwoDimensionalQpTest *this_00;
  
  WithParamInterface<bool>::parameter_ = &this->parameter_;
  this_00 = (ParameterizedTwoDimensionalQpTest *)operator_new(0x20);
  osqp::anon_unknown_0::ParameterizedTwoDimensionalQpTest::ParameterizedTwoDimensionalQpTest
            (this_00);
  (this_00->super_WithParamInterface<bool>)._vptr_WithParamInterface =
       (_func_int **)&PTR__ParameterizedTwoDimensionalQpTest_001eecb0;
  (this_00->super_TwoDimensionalQpTest).super_Test._vptr_Test = (_func_int **)&DAT_001eecd8;
  return &(this_00->super_TwoDimensionalQpTest).super_Test;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }